

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellReissner4::SetupInitial(ChElementShellReissner4 *this,ChSystem *system)

{
  ChVector<double> *v;
  undefined8 *puVar1;
  undefined8 *puVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  pointer psVar71;
  element_type *peVar72;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var73;
  element_type *peVar74;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var75;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var76;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var77;
  double dVar78;
  undefined8 uVar79;
  undefined8 uVar80;
  undefined8 uVar81;
  undefined8 uVar82;
  undefined8 uVar83;
  undefined8 uVar84;
  ActualDstType actualDst;
  long lVar85;
  ChVector<double> *pCVar86;
  Index outer;
  Index inner;
  double *pdVar87;
  ChMatrixNM<double,_4,_2> *der_mat;
  int n;
  long lVar88;
  double *pdVar89;
  int ii;
  long lVar90;
  undefined **ppuVar91;
  int ii_1;
  double *xi;
  undefined1 auVar92 [64];
  undefined8 uVar93;
  XprTypeNested pMVar94;
  double dVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  double dVar158;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  ChMatrixNM<double,_2,_2> xi_i_i;
  ChMatrixNM<double,_4,_2> L_alpha_B_i;
  ChVector<double> x_1_1;
  ChVector<double> x_2_1;
  ChMatrixNM<double,_4,_IDOFS> H;
  ChVector<double> x_2;
  ChMatrixNM<double,_4,_IDOFS> tmpP;
  ChMatrixNM<double,_4,_4> M_0_Inv;
  ChVector<double> x_1;
  ChMatrixNM<double,_4,_4> M_0;
  Matrix<double,_2,_2,_1,_2,_2> local_8c0;
  ChVector<double> *local_8a0;
  ChVector<double> *local_898;
  ChMatrix33<double> *local_890;
  ChMatrixNM<double,_4,_2> *local_888;
  ChVector<double> local_880;
  double local_868;
  double local_860;
  double local_858;
  double local_850;
  double local_848;
  ulong local_830;
  double local_828;
  ulong local_820;
  ulong local_818;
  double local_810;
  ulong local_808;
  SrcXprType local_800;
  double dStack_7f8;
  ulong uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 uStack_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  double adStack_7c8 [11];
  Matrix<double,_4,_4,_1,_4,_4> *pMStack_770;
  double dStack_768;
  undefined8 uStack_760;
  double adStack_758 [11];
  undefined1 local_700 [8];
  double adStack_6f8 [7];
  undefined1 local_6c0 [64];
  undefined1 local_680 [64];
  undefined1 local_640 [64];
  undefined1 local_600 [64];
  undefined1 local_5c0 [64];
  double *local_580;
  undefined1 *local_578;
  double *local_570;
  undefined8 local_568;
  double local_520 [2];
  ulong local_510;
  double adStack_4e8 [7];
  double adStack_4b0 [7];
  double adStack_478 [7];
  Matrix<double,_4,_4,_1,_4,_4> local_440;
  ChVector<double> local_3c0;
  double local_3a8;
  double local_3a0;
  double local_398;
  double local_390;
  double local_388;
  double adStack_360 [12];
  double adStack_300 [12];
  double adStack_2a0 [12];
  double adStack_240 [12];
  double adStack_1e0 [12];
  double adStack_180 [16];
  Matrix<double,_4,_4,_1,_4,_4> local_100;
  
  SetAsNeutral(this);
  ComputeInitialNodeOrientation(this);
  dVar95 = (this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  dVar3 = (this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  dVar158 = (this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  dVar4 = (this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  dVar5 = (this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  dVar6 = (this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  dVar78 = (this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  (this->T0_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  (this->T0_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = dVar95;
  (this->T0_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = dVar3;
  (this->T0_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = dVar158;
  (this->T0_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = dVar4;
  (this->T0_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] = dVar5;
  (this->T0_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = dVar6;
  (this->T0_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] = dVar78;
  (this->T0_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       (this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  dVar95 = (this->T_0).super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  dVar3 = (this->T_0).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  dVar158 = (this->T_0).super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  dVar4 = (this->T_0).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  dVar5 = (this->T_0).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  dVar6 = (this->T_0).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  dVar78 = (this->T_0).super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  (this->T_0_0).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (this->T_0).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  (this->T_0_0).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = dVar95;
  (this->T_0_0).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = dVar3;
  (this->T_0_0).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = dVar158;
  (this->T_0_0).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = dVar4;
  (this->T_0_0).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] = dVar5;
  (this->T_0_0).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = dVar6;
  (this->T_0_0).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] = dVar78;
  (this->T_0_0).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       (this->T_0).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  lVar85 = 0x2538;
  do {
    *(undefined8 *)((long)this + lVar85 + -0x70) = *(undefined8 *)((long)this + lVar85 + -0x10);
    puVar1 = (undefined8 *)((long)this + lVar85 + -8);
    uVar93 = puVar1[1];
    puVar2 = (undefined8 *)((long)this + lVar85 + -0x68);
    *puVar2 = *puVar1;
    puVar2[1] = uVar93;
    lVar85 = lVar85 + 0x18;
  } while (lVar85 != 0x2598);
  lVar85 = 0x2dc0;
  do {
    puVar1 = (undefined8 *)((long)this + lVar85 + -0x40);
    uVar93 = puVar1[1];
    uVar79 = puVar1[2];
    uVar80 = puVar1[3];
    uVar81 = puVar1[4];
    uVar82 = puVar1[5];
    uVar83 = puVar1[6];
    uVar84 = puVar1[7];
    puVar2 = (undefined8 *)((long)this + lVar85 + -0x2c8);
    *puVar2 = *puVar1;
    puVar2[1] = uVar93;
    puVar2[2] = uVar79;
    puVar2[3] = uVar80;
    puVar2[4] = uVar81;
    puVar2[5] = uVar82;
    puVar2[6] = uVar83;
    puVar2[7] = uVar84;
    *(undefined8 *)((long)this + lVar85 + -0x288) =
         *(undefined8 *)
          ((long)&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                  _vptr_ChElementBase + lVar85);
    lVar85 = lVar85 + 0x48;
  } while (lVar85 != 12000);
  lVar85 = 12000;
  do {
    puVar1 = (undefined8 *)((long)this + lVar85 + -0x40);
    uVar93 = puVar1[1];
    uVar79 = puVar1[2];
    uVar80 = puVar1[3];
    uVar81 = puVar1[4];
    uVar82 = puVar1[5];
    uVar83 = puVar1[6];
    uVar84 = puVar1[7];
    puVar2 = (undefined8 *)((long)this + lVar85 + -0x2c8);
    *puVar2 = *puVar1;
    puVar2[1] = uVar93;
    puVar2[2] = uVar79;
    puVar2[3] = uVar80;
    puVar2[4] = uVar81;
    puVar2[5] = uVar82;
    puVar2[6] = uVar83;
    puVar2[7] = uVar84;
    *(undefined8 *)((long)this + lVar85 + -0x288) =
         *(undefined8 *)
          ((long)&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                  _vptr_ChElementBase + lVar85);
    lVar85 = lVar85 + 0x48;
  } while (lVar85 != 0x3000);
  v = this->xa;
  InterpDeriv_xi1(v,(double *)xi_0);
  InterpDeriv_xi2(v,(double *)xi_0);
  dVar95 = (this->T_0_0).super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar126._8_8_ = 0;
  auVar126._0_8_ =
       (this->T_0_0).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar141._8_8_ = 0;
  auVar141._0_8_ = local_3c0.m_data[0];
  auVar169._8_8_ = 0;
  auVar169._0_8_ =
       (this->T_0_0).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar172._8_8_ = 0;
  auVar172._0_8_ =
       (this->T_0_0).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar96._8_8_ = 0;
  auVar96._0_8_ = dVar95 * local_3c0.m_data[1];
  auVar96 = vfmadd231sd_fma(auVar96,auVar169,auVar141);
  auVar173._8_8_ = 0;
  auVar173._0_8_ = local_3c0.m_data[2];
  auVar96 = vfmadd231sd_fma(auVar96,auVar126,auVar173);
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[8] =
       auVar96._0_8_;
  (this->S_alpha_beta_0).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.
  m_data.array[0] =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
       [8];
  dVar3 = (this->T_0_0).super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar174._8_8_ = 0;
  auVar174._0_8_ =
       (this->T_0_0).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar159._8_8_ = 0;
  auVar159._0_8_ = dVar3 * local_3c0.m_data[1];
  auVar114 = vfmadd231sd_fma(auVar159,auVar172,auVar141);
  auVar114 = vfmadd231sd_fma(auVar114,auVar174,auVar173);
  dVar158 = auVar114._0_8_;
  (this->S_alpha_beta_0).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.
  m_data.array[2] = dVar158;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = local_700;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = dVar95 * adStack_6f8[0];
  auVar114 = vfmadd231sd_fma(auVar114,auVar142,auVar169);
  auVar170._8_8_ = 0;
  auVar170._0_8_ = adStack_6f8[1];
  auVar114 = vfmadd231sd_fma(auVar114,auVar170,auVar126);
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[2] =
       auVar114._0_8_;
  (this->S_alpha_beta_0).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.
  m_data.array[1] =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
       [2];
  auVar127._8_8_ = 0;
  auVar127._0_8_ = dVar3 * adStack_6f8[0];
  auVar114 = vfmadd231sd_fma(auVar127,auVar172,auVar142);
  auVar114 = vfmadd231sd_fma(auVar114,auVar174,auVar170);
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[10]
       = auVar114._0_8_;
  (this->S_alpha_beta_0).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.
  m_data.array[3] =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
       [10];
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xb]
       = dVar158 * local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                   m_data.array[2];
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[5] =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
       [10] * local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
              m_data.array[10];
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[6] =
       dVar158 * local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                 m_data.array[10];
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[9] =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
       [2] * local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data
             .array[10];
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[10]
       = local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
         array[8] *
         local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
         array[10];
  auVar143._8_8_ = 0;
  auVar143._0_8_ =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
       [0xb];
  auVar96 = vfmsub213sd_fma(auVar114,auVar96,auVar143);
  this->alpha_0 = auVar96._0_8_;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0] =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
       [8] * local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data
             .array[8];
  local_800.m_xpr = &local_100;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[1] =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
       [2] * local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data
             .array[2];
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[2] =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
       [8] * local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data
             .array[2];
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[4] =
       dVar158 * dVar158;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[8] =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
       [8] * dVar158;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[3] =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
       [2];
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[7] =
       local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
       [6];
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xc]
       = local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
         array[8];
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xd]
       = local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
         array[9];
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xe]
       = local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
         array[0xb];
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xf]
       = local_100.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
         array[10];
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run(&local_440,&local_800,(assign_op<double,_double> *)local_520);
  pdVar87 = this->P_i[0].super_PlainObjectBase<Eigen::Matrix<double,_12,_7,_1,_12,_7>_>.m_storage.
            m_data.array + 6;
  lVar85 = 0;
  do {
    xi = (double *)(&xi_i + lVar85 * 2);
    InterpDeriv_xi1(v,xi);
    InterpDeriv_xi2(v,xi);
    auVar97._8_8_ = 0;
    auVar97._0_8_ = local_830;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = this->T_0_i[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0];
    auVar128._8_8_ = 0;
    auVar128._0_8_ =
         local_828 *
         this->T_0_i[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar96 = vfmadd231sd_fma(auVar128,auVar97,auVar7);
    auVar144._8_8_ = 0;
    auVar144._0_8_ = local_820;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = this->T_0_i[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[6];
    auVar96 = vfmadd231sd_fma(auVar96,auVar144,auVar8);
    local_3c0.m_data[0] = (double)(this->S_alpha_beta_i + lVar85);
    this->S_alpha_beta_i[lVar85].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.
    m_storage.m_data.array[0] = auVar96._0_8_;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = this->T_0_i[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[1];
    auVar115._8_8_ = 0;
    auVar115._0_8_ =
         local_828 *
         this->T_0_i[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar114 = vfmadd231sd_fma(auVar115,auVar97,auVar9);
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         this->T_0_i[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar114 = vfmadd231sd_fma(auVar114,auVar144,auVar10);
    this->S_alpha_beta_i[lVar85].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.
    m_storage.m_data.array[2] = auVar114._0_8_;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = local_818;
    auVar11._8_8_ = 0;
    auVar11._0_8_ =
         this->T_0_i[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar160._8_8_ = 0;
    auVar160._0_8_ =
         local_810 *
         this->T_0_i[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar126 = vfmadd231sd_fma(auVar160,auVar98,auVar11);
    auVar171._8_8_ = 0;
    auVar171._0_8_ = local_808;
    auVar12._8_8_ = 0;
    auVar12._0_8_ =
         this->T_0_i[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar126 = vfmadd231sd_fma(auVar126,auVar171,auVar12);
    this->S_alpha_beta_i[lVar85].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.
    m_storage.m_data.array[1] = auVar126._0_8_;
    auVar13._8_8_ = 0;
    auVar13._0_8_ =
         this->T_0_i[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar145._8_8_ = 0;
    auVar145._0_8_ =
         local_810 *
         this->T_0_i[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar127 = vfmadd231sd_fma(auVar145,auVar98,auVar13);
    auVar14._8_8_ = 0;
    auVar14._0_8_ =
         this->T_0_i[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar127 = vfmadd231sd_fma(auVar127,auVar171,auVar14);
    this->S_alpha_beta_i[lVar85].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.
    m_storage.m_data.array[3] = auVar127._0_8_;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = auVar114._0_8_ * auVar126._0_8_;
    auVar96 = vfmsub231sd_fma(auVar99,auVar96,auVar127);
    this->alpha_i[lVar85] = auVar96._0_8_;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_2,_2,_1,_2,_2>,_Eigen::Inverse<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(&local_8c0,(SrcXprType *)&local_3c0,(assign_op<double,_double> *)local_700);
    pdVar89 = local_880.m_data;
    ppuVar91 = &LI_J;
    lVar88 = 0;
    do {
      lVar90 = 0;
      do {
        uVar93 = (*(code *)ppuVar91[lVar90])(xi);
        pdVar89[lVar90] = (double)uVar93;
        lVar90 = lVar90 + 1;
      } while (lVar90 == 1);
      lVar88 = lVar88 + 1;
      ppuVar91 = ppuVar91 + 2;
      pdVar89 = pdVar89 + 2;
    } while (lVar88 != 4);
    this->L_alpha_beta_i[lVar85].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.
    m_storage.m_data.array[0] =
         local_880.m_data[0] *
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.
         array[0] +
         local_880.m_data[1] *
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.
         array[2];
    this->L_alpha_beta_i[lVar85].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.
    m_storage.m_data.array[1] =
         local_880.m_data[0] *
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.
         array[1] +
         local_880.m_data[1] *
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.
         array[3];
    this->L_alpha_beta_i[lVar85].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.
    m_storage.m_data.array[2] =
         local_868 *
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.
         array[2] +
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.
         array[0] * local_880.m_data[2];
    this->L_alpha_beta_i[lVar85].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.
    m_storage.m_data.array[3] =
         local_880.m_data[2] *
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.
         array[1] +
         local_868 *
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.
         array[3];
    this->L_alpha_beta_i[lVar85].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.
    m_storage.m_data.array[4] =
         local_860 *
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.
         array[0] +
         local_858 *
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.
         array[2];
    this->L_alpha_beta_i[lVar85].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.
    m_storage.m_data.array[5] =
         local_858 *
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.
         array[3] +
         local_860 *
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.
         array[1];
    this->L_alpha_beta_i[lVar85].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.
    m_storage.m_data.array[6] =
         local_850 *
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.
         array[0] +
         local_848 *
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.
         array[2];
    this->L_alpha_beta_i[lVar85].super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>.
    m_storage.m_data.array[7] =
         local_850 *
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.
         array[1] +
         local_848 *
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.
         array[3];
    local_800.m_xpr = (XprTypeNested)*xi;
    adStack_7c8[2] = (double)(&DAT_00b92d68)[lVar85 * 2];
    dStack_7f8 = (double)local_800.m_xpr * adStack_7c8[2];
    uStack_7f0 = 0;
    uStack_7e8 = 0;
    uStack_7e0 = 0;
    uStack_7d8 = 0;
    uStack_7d0 = 0;
    adStack_7c8[0] = 0.0;
    adStack_7c8[1] = 0.0;
    adStack_7c8[4] = 0.0;
    adStack_7c8[5] = 0.0;
    adStack_7c8[6] = 0.0;
    adStack_7c8[7] = 0.0;
    adStack_7c8[8] = 0.0;
    adStack_7c8[9] = 0.0;
    adStack_7c8[10] = 0.0;
    uStack_760 = 0;
    adStack_758[0] = 0.0;
    adStack_758[1] = 0.0;
    adStack_758[2] = 0.0;
    adStack_758[3] = 0.0;
    adStack_758[4] = 0.0;
    adStack_7c8[3] = dStack_7f8;
    pMStack_770 = local_800.m_xpr;
    dStack_768 = dStack_7f8;
    adStack_758[6] = adStack_7c8[2];
    adStack_758[5] = dStack_7f8;
    lVar88 = 0;
    pCVar86 = &local_3c0;
    pdVar89 = local_520;
    do {
      dVar95 = local_440.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
               m_data.array[lVar88];
      dVar3 = local_440.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
              m_data.array[lVar88 + 4];
      dVar158 = local_440.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                m_data.array[lVar88 + 8];
      dVar4 = local_440.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
              m_data.array[lVar88 + 0xc];
      lVar90 = 0;
      do {
        pdVar89[lVar90] =
             dVar95 * (double)(&local_800)[lVar90].m_xpr + dVar3 * adStack_7c8[lVar90] +
             dVar158 * adStack_7c8[lVar90 + 7] + dVar4 * adStack_758[lVar90];
        lVar90 = lVar90 + 1;
      } while (lVar90 != 7);
      lVar88 = lVar88 + 1;
      pdVar89 = pdVar89 + 7;
    } while (lVar88 != 4);
    auVar100._0_8_ = this->alpha_0 / this->alpha_i[lVar85];
    auVar100._8_8_ = 0;
    auVar92 = vbroadcastsd_avx512f(auVar100);
    _local_700 = vmulpd_avx512f(auVar92,_DAT_009e0340);
    local_6c0 = vmulpd_avx512f(auVar92,_DAT_009e0380);
    local_680 = vmulpd_avx512f(auVar92,_DAT_009e03c0);
    auVar101._8_8_ = 0;
    auVar101._0_8_ = auVar100._0_8_ * 0.0;
    local_640 = vbroadcastsd_avx512f(auVar101);
    local_600 = local_640;
    local_5c0 = local_640;
    local_580 = local_520;
    local_578 = local_700;
    local_570 = local_520;
    local_568 = 4;
    lVar88 = 0;
    do {
      dVar95 = local_520[lVar88];
      dVar3 = adStack_4e8[lVar88];
      dVar158 = adStack_4b0[lVar88];
      dVar4 = adStack_478[lVar88];
      lVar90 = 0;
      do {
        *(double *)((long)pCVar86->m_data + lVar90) =
             dVar95 * *(double *)(local_700 + lVar90 * 4) +
             dVar3 * *(double *)(local_700 + lVar90 * 4 + 8) +
             dVar158 * *(double *)(local_700 + lVar90 * 4 + 0x10) +
             dVar4 * *(double *)(local_700 + lVar90 * 4 + 0x18);
        lVar90 = lVar90 + 8;
      } while (lVar90 != 0x60);
      lVar88 = lVar88 + 1;
      pCVar86 = pCVar86 + 4;
    } while (lVar88 != 7);
    lVar88 = 0;
    pdVar89 = pdVar87;
    do {
      ((plain_array<double,_84,_1,_32> *)(pdVar89 + -6))->array[0] = local_3c0.m_data[lVar88];
      pdVar89[-5] = adStack_360[lVar88];
      pdVar89[-4] = adStack_300[lVar88];
      pdVar89[-3] = adStack_2a0[lVar88];
      pdVar89[-2] = adStack_240[lVar88];
      pdVar89[-1] = adStack_1e0[lVar88];
      *pdVar89 = adStack_180[lVar88];
      lVar88 = lVar88 + 1;
      pdVar89 = pdVar89 + 7;
    } while (lVar88 != 0xc);
    lVar85 = lVar85 + 1;
    pdVar87 = pdVar87 + 0x54;
  } while (lVar85 != 4);
  ComputeIPCurvature(this);
  lVar85 = -0x60;
  lVar90 = 0x2dc0;
  lVar88 = 0x4ac0;
  do {
    pCVar86 = (ChVector<double> *)
              ((long)(this->beta).super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.
                     m_storage.m_data.array + lVar85);
    InterpDeriv(v,(ChMatrixNM<double,_4,_2> *)
                  ((long)&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                          _vptr_ChElementBase + lVar88),
                (ChVector<double> *)((long)this->y_i_2[0].m_data + lVar85),pCVar86);
    auVar102._8_8_ = 0;
    auVar102._0_8_ = pCVar86[-4].m_data[2];
    auVar116._8_8_ = 0;
    auVar116._0_8_ = pCVar86[-4].m_data[0];
    dVar95 = pCVar86[-4].m_data[1];
    auVar15._8_8_ = 0;
    auVar15._0_8_ = *(ulong *)((long)this + lVar90 + -0x30);
    auVar146._8_8_ = 0;
    auVar146._0_8_ = dVar95 * *(double *)((long)this + lVar90 + -0x18);
    auVar96 = vfmadd231sd_fma(auVar146,auVar116,auVar15);
    auVar16._8_8_ = 0;
    auVar16._0_8_ =
         *(ulong *)((long)&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                           _vptr_ChElementBase + lVar90);
    auVar96 = vfmadd231sd_fma(auVar96,auVar102,auVar16);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = *(ulong *)((long)this + lVar90 + -0x38);
    auVar161._8_8_ = 0;
    auVar161._0_8_ = dVar95 * *(double *)((long)this + lVar90 + -0x20);
    auVar114 = vfmadd231sd_fma(auVar161,auVar116,auVar17);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = *(ulong *)((long)this + lVar90 + -8);
    auVar114 = vfmadd231sd_fma(auVar114,auVar102,auVar18);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = *(ulong *)((long)this + lVar90 + -0x40);
    auVar129._8_8_ = 0;
    auVar129._0_8_ = dVar95 * *(double *)((long)this + lVar90 + -0x28);
    auVar126 = vfmadd231sd_fma(auVar129,auVar116,auVar19);
    auVar20._8_8_ = 0;
    auVar20._0_8_ = *(ulong *)((long)this + lVar90 + -0x10);
    auVar126 = vfmadd231sd_fma(auVar126,auVar102,auVar20);
    pCVar86[-0x597].m_data[1] = auVar126._0_8_;
    pCVar86[-0x597].m_data[2] = auVar114._0_8_;
    pCVar86[-0x596].m_data[0] = auVar96._0_8_;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = pCVar86->m_data[2];
    auVar117._8_8_ = 0;
    auVar117._0_8_ = pCVar86->m_data[0];
    dVar95 = pCVar86->m_data[1];
    auVar21._8_8_ = 0;
    auVar21._0_8_ = *(ulong *)((long)this + lVar90 + -0x30);
    auVar147._8_8_ = 0;
    auVar147._0_8_ = dVar95 * *(double *)((long)this + lVar90 + -0x18);
    auVar96 = vfmadd231sd_fma(auVar147,auVar117,auVar21);
    auVar22._8_8_ = 0;
    auVar22._0_8_ =
         *(ulong *)((long)&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                           _vptr_ChElementBase + lVar90);
    auVar96 = vfmadd231sd_fma(auVar96,auVar103,auVar22);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = *(ulong *)((long)this + lVar90 + -0x38);
    auVar162._8_8_ = 0;
    auVar162._0_8_ = dVar95 * *(double *)((long)this + lVar90 + -0x20);
    auVar114 = vfmadd231sd_fma(auVar162,auVar117,auVar23);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = *(ulong *)((long)this + lVar90 + -8);
    auVar114 = vfmadd231sd_fma(auVar114,auVar103,auVar24);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = *(ulong *)((long)this + lVar90 + -0x40);
    auVar130._8_8_ = 0;
    auVar130._0_8_ = dVar95 * *(double *)((long)this + lVar90 + -0x28);
    auVar126 = vfmadd231sd_fma(auVar130,auVar117,auVar25);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = *(ulong *)((long)this + lVar90 + -0x10);
    auVar126 = vfmadd231sd_fma(auVar126,auVar103,auVar26);
    pCVar86[-0x593].m_data[1] = auVar126._0_8_;
    pCVar86[-0x593].m_data[2] = auVar114._0_8_;
    pCVar86[-0x592].m_data[0] = auVar96._0_8_;
    auVar104._8_8_ = 0;
    auVar104._0_8_ = pCVar86[-0x59e].m_data[0];
    auVar118._8_8_ = 0;
    auVar118._0_8_ = pCVar86[-0x59f].m_data[1];
    dVar95 = pCVar86[-0x59f].m_data[2];
    auVar27._8_8_ = 0;
    auVar27._0_8_ = *(ulong *)((long)this + lVar90 + -0x30);
    auVar148._8_8_ = 0;
    auVar148._0_8_ = dVar95 * *(double *)((long)this + lVar90 + -0x18);
    auVar96 = vfmadd231sd_fma(auVar148,auVar118,auVar27);
    auVar28._8_8_ = 0;
    auVar28._0_8_ =
         *(ulong *)((long)&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                           _vptr_ChElementBase + lVar90);
    auVar96 = vfmadd231sd_fma(auVar96,auVar104,auVar28);
    auVar29._8_8_ = 0;
    auVar29._0_8_ = *(ulong *)((long)this + lVar90 + -0x38);
    auVar163._8_8_ = 0;
    auVar163._0_8_ = dVar95 * *(double *)((long)this + lVar90 + -0x20);
    auVar114 = vfmadd231sd_fma(auVar163,auVar118,auVar29);
    auVar30._8_8_ = 0;
    auVar30._0_8_ = *(ulong *)((long)this + lVar90 + -8);
    auVar114 = vfmadd231sd_fma(auVar114,auVar104,auVar30);
    auVar31._8_8_ = 0;
    auVar31._0_8_ = *(ulong *)((long)this + lVar90 + -0x40);
    auVar131._8_8_ = 0;
    auVar131._0_8_ = dVar95 * *(double *)((long)this + lVar90 + -0x28);
    auVar126 = vfmadd231sd_fma(auVar131,auVar118,auVar31);
    auVar32._8_8_ = 0;
    auVar32._0_8_ = *(ulong *)((long)this + lVar90 + -0x10);
    auVar126 = vfmadd231sd_fma(auVar126,auVar104,auVar32);
    pCVar86[-0x577].m_data[1] = auVar126._0_8_;
    pCVar86[-0x577].m_data[2] = auVar114._0_8_;
    pCVar86[-0x576].m_data[0] = auVar96._0_8_;
    auVar105._8_8_ = 0;
    auVar105._0_8_ = pCVar86[-0x59a].m_data[0];
    auVar119._8_8_ = 0;
    auVar119._0_8_ = pCVar86[-0x59b].m_data[1];
    dVar95 = pCVar86[-0x59b].m_data[2];
    auVar33._8_8_ = 0;
    auVar33._0_8_ = *(ulong *)((long)this + lVar90 + -0x30);
    auVar149._8_8_ = 0;
    auVar149._0_8_ = dVar95 * *(double *)((long)this + lVar90 + -0x18);
    auVar96 = vfmadd231sd_fma(auVar149,auVar119,auVar33);
    auVar34._8_8_ = 0;
    auVar34._0_8_ =
         *(ulong *)((long)&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                           _vptr_ChElementBase + lVar90);
    auVar96 = vfmadd231sd_fma(auVar96,auVar105,auVar34);
    auVar35._8_8_ = 0;
    auVar35._0_8_ = *(ulong *)((long)this + lVar90 + -0x38);
    auVar164._8_8_ = 0;
    auVar164._0_8_ = dVar95 * *(double *)((long)this + lVar90 + -0x20);
    auVar114 = vfmadd231sd_fma(auVar164,auVar119,auVar35);
    auVar36._8_8_ = 0;
    auVar36._0_8_ = *(ulong *)((long)this + lVar90 + -8);
    auVar114 = vfmadd231sd_fma(auVar114,auVar105,auVar36);
    auVar37._8_8_ = 0;
    auVar37._0_8_ = *(ulong *)((long)this + lVar90 + -0x40);
    auVar132._8_8_ = 0;
    auVar132._0_8_ = dVar95 * *(double *)((long)this + lVar90 + -0x28);
    auVar126 = vfmadd231sd_fma(auVar132,auVar119,auVar37);
    auVar38._8_8_ = 0;
    auVar38._0_8_ = *(ulong *)((long)this + lVar90 + -0x10);
    auVar126 = vfmadd231sd_fma(auVar126,auVar105,auVar38);
    pCVar86[-0x573].m_data[1] = auVar126._0_8_;
    pCVar86[-0x573].m_data[2] = auVar114._0_8_;
    pCVar86[-0x572].m_data[0] = auVar96._0_8_;
    lVar90 = lVar90 + 0x48;
    lVar88 = lVar88 + 0x40;
    lVar85 = lVar85 + 0x18;
  } while (lVar85 != 0);
  local_888 = this->L_alpha_beta_A;
  local_890 = this->T_A;
  local_898 = this->eps_tilde_1_0_A;
  local_8a0 = this->eps_tilde_2_0_A;
  lVar85 = 0;
  do {
    pdVar89 = (double *)(xi_A + lVar85 * 0x10);
    InterpDeriv_xi1(v,pdVar89);
    InterpDeriv_xi2(v,pdVar89);
    auVar106._8_8_ = 0;
    auVar106._0_8_ = local_800.m_xpr;
    auVar39._8_8_ = 0;
    auVar39._0_8_ =
         this->T_0_A[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar133._8_8_ = 0;
    auVar133._0_8_ =
         dStack_7f8 *
         this->T_0_A[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar96 = vfmadd231sd_fma(auVar133,auVar106,auVar39);
    auVar150._8_8_ = 0;
    auVar150._0_8_ = uStack_7f0;
    auVar40._8_8_ = 0;
    auVar40._0_8_ =
         this->T_0_A[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar96 = vfmadd231sd_fma(auVar96,auVar150,auVar40);
    this->S_alpha_beta_A[lVar85].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.
    m_storage.m_data.array[0] = auVar96._0_8_;
    auVar41._8_8_ = 0;
    auVar41._0_8_ =
         this->T_0_A[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar120._8_8_ = 0;
    auVar120._0_8_ =
         dStack_7f8 *
         this->T_0_A[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar96 = vfmadd231sd_fma(auVar120,auVar106,auVar41);
    auVar42._8_8_ = 0;
    auVar42._0_8_ =
         this->T_0_A[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar96 = vfmadd231sd_fma(auVar96,auVar150,auVar42);
    this->S_alpha_beta_A[lVar85].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.
    m_storage.m_data.array[2] = auVar96._0_8_;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = local_520[0];
    auVar43._8_8_ = 0;
    auVar43._0_8_ =
         this->T_0_A[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar134._8_8_ = 0;
    auVar134._0_8_ =
         local_520[1] *
         this->T_0_A[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar96 = vfmadd231sd_fma(auVar134,auVar107,auVar43);
    auVar151._8_8_ = 0;
    auVar151._0_8_ = local_510;
    auVar44._8_8_ = 0;
    auVar44._0_8_ =
         this->T_0_A[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar96 = vfmadd231sd_fma(auVar96,auVar151,auVar44);
    this->S_alpha_beta_A[lVar85].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.
    m_storage.m_data.array[1] = auVar96._0_8_;
    auVar45._8_8_ = 0;
    auVar45._0_8_ =
         this->T_0_A[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar121._8_8_ = 0;
    auVar121._0_8_ =
         local_520[1] *
         this->T_0_A[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar96 = vfmadd231sd_fma(auVar121,auVar107,auVar45);
    auVar46._8_8_ = 0;
    auVar46._0_8_ =
         this->T_0_A[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar96 = vfmadd231sd_fma(auVar96,auVar151,auVar46);
    this->S_alpha_beta_A[lVar85].super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.
    m_storage.m_data.array[3] = auVar96._0_8_;
    local_880.m_data[2] = 0.0;
    local_880.m_data[0] = 0.0;
    local_880.m_data[1] = 0.0;
    local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.array[2]
         = 0.0;
    local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.array[0]
         = 0.0;
    local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.array[1]
         = 0.0;
    der_mat = local_888 + lVar85;
    InterpDeriv(v,der_mat,&local_880,(ChVector<double> *)&local_8c0);
    auVar108._8_8_ = 0;
    auVar108._0_8_ = local_880.m_data[2];
    auVar122._8_8_ = 0;
    auVar122._0_8_ = local_880.m_data[0];
    auVar47._8_8_ = 0;
    auVar47._0_8_ =
         local_890[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar152._8_8_ = 0;
    auVar152._0_8_ =
         local_880.m_data[1] *
         local_890[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar96 = vfmadd231sd_fma(auVar152,auVar122,auVar47);
    auVar48._8_8_ = 0;
    auVar48._0_8_ =
         local_890[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar96 = vfmadd231sd_fma(auVar96,auVar108,auVar48);
    auVar49._8_8_ = 0;
    auVar49._0_8_ =
         local_890[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar165._8_8_ = 0;
    auVar165._0_8_ =
         local_880.m_data[1] *
         local_890[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar114 = vfmadd231sd_fma(auVar165,auVar122,auVar49);
    auVar50._8_8_ = 0;
    auVar50._0_8_ =
         local_890[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar114 = vfmadd231sd_fma(auVar114,auVar108,auVar50);
    auVar51._8_8_ = 0;
    auVar51._0_8_ =
         local_890[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar135._8_8_ = 0;
    auVar135._0_8_ =
         local_880.m_data[1] *
         local_890[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar126 = vfmadd231sd_fma(auVar135,auVar122,auVar51);
    auVar52._8_8_ = 0;
    auVar52._0_8_ =
         local_890[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar126 = vfmadd231sd_fma(auVar126,auVar108,auVar52);
    local_898[lVar85].m_data[0] = auVar126._0_8_;
    local_898[lVar85].m_data[1] = auVar114._0_8_;
    local_898[lVar85].m_data[2] = auVar96._0_8_;
    auVar109._8_8_ = 0;
    auVar109._0_8_ =
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.
         array[2];
    auVar123._8_8_ = 0;
    auVar123._0_8_ =
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.
         array[0];
    auVar53._8_8_ = 0;
    auVar53._0_8_ =
         local_890[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar153._8_8_ = 0;
    auVar153._0_8_ =
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.
         array[1] *
         local_890[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar96 = vfmadd231sd_fma(auVar153,auVar123,auVar53);
    auVar54._8_8_ = 0;
    auVar54._0_8_ =
         local_890[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar96 = vfmadd231sd_fma(auVar96,auVar109,auVar54);
    auVar55._8_8_ = 0;
    auVar55._0_8_ =
         local_890[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar166._8_8_ = 0;
    auVar166._0_8_ =
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.
         array[1] *
         local_890[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar114 = vfmadd231sd_fma(auVar166,auVar123,auVar55);
    auVar56._8_8_ = 0;
    auVar56._0_8_ =
         local_890[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar114 = vfmadd231sd_fma(auVar114,auVar109,auVar56);
    auVar57._8_8_ = 0;
    auVar57._0_8_ =
         local_890[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar136._8_8_ = 0;
    auVar136._0_8_ =
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.
         array[1] *
         local_890[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar126 = vfmadd231sd_fma(auVar136,auVar123,auVar57);
    auVar58._8_8_ = 0;
    auVar58._0_8_ =
         local_890[lVar85].super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar126 = vfmadd231sd_fma(auVar126,auVar109,auVar58);
    local_8a0[lVar85].m_data[0] = auVar126._0_8_;
    local_8a0[lVar85].m_data[1] = auVar114._0_8_;
    local_8a0[lVar85].m_data[2] = auVar96._0_8_;
    pdVar87 = local_3c0.m_data;
    local_3c0.m_data[0] = (double)(this->S_alpha_beta_A + lVar85);
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_2,_2,_1,_2,_2>,_Eigen::Inverse<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run((Matrix<double,_2,_2,_1,_2,_2> *)local_700,(SrcXprType *)pdVar87,
          (assign_op<double,_double> *)&local_830);
    ppuVar91 = &LI_J;
    lVar88 = 0;
    do {
      lVar90 = 0;
      do {
        pMVar94 = (XprTypeNested)(*(code *)ppuVar91[lVar90])(pdVar89);
        ((SrcXprType *)(pdVar87 + lVar90))->m_xpr = pMVar94;
        lVar90 = lVar90 + 1;
      } while (lVar90 == 1);
      lVar88 = lVar88 + 1;
      ppuVar91 = ppuVar91 + 2;
      pdVar87 = pdVar87 + 2;
    } while (lVar88 != 4);
    (der_mat->super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>).m_storage.m_data.array
    [0] = local_3c0.m_data[0] * (double)local_700 + local_3c0.m_data[1] * adStack_6f8[1];
    (der_mat->super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>).m_storage.m_data.array
    [1] = local_3c0.m_data[0] * adStack_6f8[0] + local_3c0.m_data[1] * adStack_6f8[2];
    (der_mat->super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>).m_storage.m_data.array
    [2] = local_3a8 * adStack_6f8[1] + (double)local_700 * local_3c0.m_data[2];
    (der_mat->super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>).m_storage.m_data.array
    [3] = local_3c0.m_data[2] * adStack_6f8[0] + local_3a8 * adStack_6f8[2];
    (der_mat->super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>).m_storage.m_data.array
    [4] = local_3a0 * (double)local_700 + local_398 * adStack_6f8[1];
    (der_mat->super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>).m_storage.m_data.array
    [5] = local_398 * adStack_6f8[2] + local_3a0 * adStack_6f8[0];
    (der_mat->super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>).m_storage.m_data.array
    [6] = local_390 * (double)local_700 + local_388 * adStack_6f8[1];
    (der_mat->super_PlainObjectBase<Eigen::Matrix<double,_4,_2,_1,_4,_2>_>).m_storage.m_data.array
    [7] = local_390 * adStack_6f8[0] + local_388 * adStack_6f8[2];
    lVar85 = lVar85 + 1;
  } while (lVar85 != 4);
  local_3c0.m_data[0] = 0.0;
  local_3c0.m_data[1] = 0.0;
  local_3c0.m_data[2] = 0.0;
  adStack_6f8[1] = 0.0;
  _local_700 = ZEXT816(0);
  pdVar87 = this->eps_tilde_2_0_A[0].m_data + 2;
  pdVar89 = this->T_A[0].super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 8;
  lVar85 = 0x4bc0;
  do {
    InterpDeriv(v,(ChMatrixNM<double,_4,_2> *)
                  ((long)&(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                          _vptr_ChElementBase + lVar85),&local_3c0,(ChVector<double> *)local_700);
    auVar110._8_8_ = 0;
    auVar110._0_8_ = local_3c0.m_data[2];
    auVar124._8_8_ = 0;
    auVar124._0_8_ = local_3c0.m_data[0];
    auVar59._8_8_ = 0;
    auVar59._0_8_ = pdVar89[-6];
    auVar154._8_8_ = 0;
    auVar154._0_8_ = local_3c0.m_data[1] * pdVar89[-3];
    auVar96 = vfmadd231sd_fma(auVar154,auVar124,auVar59);
    auVar60._8_8_ = 0;
    auVar60._0_8_ = *pdVar89;
    auVar96 = vfmadd231sd_fma(auVar96,auVar110,auVar60);
    auVar61._8_8_ = 0;
    auVar61._0_8_ = pdVar89[-7];
    auVar167._8_8_ = 0;
    auVar167._0_8_ = local_3c0.m_data[1] * pdVar89[-4];
    auVar114 = vfmadd231sd_fma(auVar167,auVar124,auVar61);
    auVar62._8_8_ = 0;
    auVar62._0_8_ = pdVar89[-1];
    auVar114 = vfmadd231sd_fma(auVar114,auVar110,auVar62);
    auVar63._8_8_ = 0;
    auVar63._0_8_ = ((plain_array<double,_9,_1,_0> *)(pdVar89 + -8))->array[0];
    auVar137._8_8_ = 0;
    auVar137._0_8_ = local_3c0.m_data[1] * pdVar89[-5];
    auVar126 = vfmadd231sd_fma(auVar137,auVar124,auVar63);
    auVar64._8_8_ = 0;
    auVar64._0_8_ = pdVar89[-2];
    auVar126 = vfmadd231sd_fma(auVar126,auVar110,auVar64);
    pdVar87[-0xe] = (double)auVar126._0_8_;
    pdVar87[-0xd] = (double)auVar114._0_8_;
    pdVar87[-0xc] = (double)auVar96._0_8_;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = adStack_6f8[1];
    auVar125._8_8_ = 0;
    auVar125._0_8_ = local_700;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = pdVar89[-6];
    auVar155._8_8_ = 0;
    auVar155._0_8_ = adStack_6f8[0] * pdVar89[-3];
    auVar96 = vfmadd231sd_fma(auVar155,auVar125,auVar65);
    auVar66._8_8_ = 0;
    auVar66._0_8_ = *pdVar89;
    auVar96 = vfmadd231sd_fma(auVar96,auVar111,auVar66);
    auVar67._8_8_ = 0;
    auVar67._0_8_ = pdVar89[-7];
    auVar168._8_8_ = 0;
    auVar168._0_8_ = adStack_6f8[0] * pdVar89[-4];
    auVar114 = vfmadd231sd_fma(auVar168,auVar125,auVar67);
    auVar68._8_8_ = 0;
    auVar68._0_8_ = pdVar89[-1];
    auVar114 = vfmadd231sd_fma(auVar114,auVar111,auVar68);
    auVar69._8_8_ = 0;
    auVar69._0_8_ = ((plain_array<double,_9,_1,_0> *)(pdVar89 + -8))->array[0];
    auVar138._8_8_ = 0;
    auVar138._0_8_ = adStack_6f8[0] * pdVar89[-5];
    auVar126 = vfmadd231sd_fma(auVar138,auVar125,auVar69);
    auVar70._8_8_ = 0;
    auVar70._0_8_ = pdVar89[-2];
    auVar126 = vfmadd231sd_fma(auVar126,auVar111,auVar70);
    ((ChVector<double> *)(pdVar87 + -2))->m_data[0] = auVar126._0_8_;
    pdVar87[-1] = auVar114._0_8_;
    *pdVar87 = auVar96._0_8_;
    pdVar87 = pdVar87 + 3;
    pdVar89 = pdVar89 + 9;
    lVar85 = lVar85 + 0x40;
  } while (lVar85 != 0x4cc0);
  psVar71 = (this->m_nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  peVar72 = (psVar71->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr;
  p_Var73 = (psVar71->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  if (p_Var73 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var73->_M_use_count = p_Var73->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var73->_M_use_count = p_Var73->_M_use_count + 1;
    }
  }
  psVar71 = (this->m_nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  peVar74 = psVar71[3].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  p_Var75 = psVar71[3].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (p_Var75 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var75->_M_use_count = p_Var75->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var75->_M_use_count = p_Var75->_M_use_count + 1;
    }
  }
  dVar95 = *(double *)((long)&peVar72->super_ChNodeFEAbase + 0x20);
  dVar3 = *(double *)&peVar72->field_0x28;
  dVar158 = *(double *)((long)&peVar74->super_ChNodeFEAbase + 0x20);
  dVar4 = *(double *)&peVar74->field_0x28;
  dVar5 = *(double *)&peVar72->field_0x30;
  dVar6 = *(double *)&peVar74->field_0x30;
  psVar71 = (this->m_nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  peVar72 = psVar71[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  p_Var76 = psVar71[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (p_Var76 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var76->_M_use_count = p_Var76->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var76->_M_use_count = p_Var76->_M_use_count + 1;
    }
  }
  psVar71 = (this->m_nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  peVar74 = psVar71[2].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  p_Var77 = psVar71[2].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (p_Var77 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var77->_M_use_count = p_Var77->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var77->_M_use_count = p_Var77->_M_use_count + 1;
    }
  }
  dVar3 = (dVar3 + dVar4) * 0.5 -
          (*(double *)&peVar72->field_0x28 + *(double *)&peVar74->field_0x28) * 0.5;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = dVar3 * dVar3;
  auVar139._8_8_ = 0;
  auVar139._0_8_ =
       (dVar95 + dVar158) * 0.5 -
       (*(double *)((long)&peVar72->super_ChNodeFEAbase + 0x20) +
       *(double *)((long)&peVar74->super_ChNodeFEAbase + 0x20)) * 0.5;
  auVar96 = vfmadd231sd_fma(auVar112,auVar139,auVar139);
  auVar156._8_8_ = 0;
  auVar156._0_8_ =
       (dVar5 + dVar6) * 0.5 -
       (*(double *)&peVar72->field_0x30 + *(double *)&peVar74->field_0x30) * 0.5;
  auVar96 = vfmadd231sd_fma(auVar96,auVar156,auVar156);
  if (auVar96._0_8_ < 0.0) {
    dVar95 = sqrt(auVar96._0_8_);
  }
  else {
    auVar96 = vsqrtsd_avx(auVar96,auVar96);
    dVar95 = auVar96._0_8_;
  }
  this->m_lenX = dVar95;
  if (p_Var77 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var77);
  }
  if (p_Var76 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var76);
  }
  if (p_Var75 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var75);
  }
  if (p_Var73 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var73);
  }
  psVar71 = (this->m_nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  peVar72 = (psVar71->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr;
  p_Var73 = (psVar71->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  if (p_Var73 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var73->_M_use_count = p_Var73->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var73->_M_use_count = p_Var73->_M_use_count + 1;
    }
  }
  psVar71 = (this->m_nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  peVar74 = psVar71[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  p_Var75 = psVar71[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (p_Var75 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var75->_M_use_count = p_Var75->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var75->_M_use_count = p_Var75->_M_use_count + 1;
    }
  }
  dVar95 = *(double *)((long)&peVar72->super_ChNodeFEAbase + 0x20);
  dVar3 = *(double *)&peVar72->field_0x28;
  dVar158 = *(double *)((long)&peVar74->super_ChNodeFEAbase + 0x20);
  dVar4 = *(double *)&peVar74->field_0x28;
  dVar5 = *(double *)&peVar72->field_0x30;
  dVar6 = *(double *)&peVar74->field_0x30;
  psVar71 = (this->m_nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  peVar72 = psVar71[3].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  p_Var76 = psVar71[3].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (p_Var76 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var76->_M_use_count = p_Var76->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var76->_M_use_count = p_Var76->_M_use_count + 1;
    }
  }
  psVar71 = (this->m_nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  peVar74 = psVar71[2].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  p_Var77 = psVar71[2].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (p_Var77 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var77->_M_use_count = p_Var77->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var77->_M_use_count = p_Var77->_M_use_count + 1;
    }
  }
  dVar3 = (dVar3 + dVar4) * 0.5 -
          (*(double *)&peVar72->field_0x28 + *(double *)&peVar74->field_0x28) * 0.5;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = dVar3 * dVar3;
  auVar140._8_8_ = 0;
  auVar140._0_8_ =
       (dVar95 + dVar158) * 0.5 -
       (*(double *)((long)&peVar72->super_ChNodeFEAbase + 0x20) +
       *(double *)((long)&peVar74->super_ChNodeFEAbase + 0x20)) * 0.5;
  auVar96 = vfmadd231sd_fma(auVar113,auVar140,auVar140);
  auVar157._8_8_ = 0;
  auVar157._0_8_ =
       (dVar5 + dVar6) * 0.5 -
       (*(double *)&peVar72->field_0x30 + *(double *)&peVar74->field_0x30) * 0.5;
  auVar96 = vfmadd231sd_fma(auVar96,auVar157,auVar157);
  if (auVar96._0_8_ < 0.0) {
    dVar95 = sqrt(auVar96._0_8_);
  }
  else {
    auVar96 = vsqrtsd_avx(auVar96,auVar96);
    dVar95 = auVar96._0_8_;
  }
  this->m_lenY = dVar95;
  if (p_Var77 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var77);
  }
  if (p_Var76 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var76);
  }
  if (p_Var75 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var75);
  }
  if (p_Var73 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var73);
  }
  ComputeMassMatrix(this);
  return;
}

Assistant:

void ChElementShellReissner4::SetupInitial(ChSystem* system) {
    // Align initial pos/rot of nodes to actual pos/rot
    SetAsNeutral();

    ComputeInitialNodeOrientation();
    // 	UpdateNodalAndAveragePosAndOrientation();
    // 	InterpolateOrientation();
    // copy ref values
    T0_overline = T_overline;
    T_0_0 = T_0;
    for (int i = 0; i < NUMNODES; i++) {
        xa_0[i] = xa[i];
    }
    for (int i = 0; i < NUMIP; i++) {
        T_0_i[i] = T_i[i];
    }
    for (int i = 0; i < NUMSSEP; i++) {
        T_0_A[i] = T_A[i];
    }

    ChMatrixNM<double, 4, 4> M_0;
    ChMatrixNM<double, 4, 4> M_0_Inv;
    {
        ChVector<> x_1 = InterpDeriv_xi1(xa, xi_0);
        ChVector<> x_2 = InterpDeriv_xi2(xa, xi_0);
        S_alpha_beta_0(0, 0) = T_0_0.Get_A_Xaxis() ^ x_1;
        S_alpha_beta_0(1, 0) = T_0_0.Get_A_Yaxis() ^ x_1;
        S_alpha_beta_0(0, 1) = T_0_0.Get_A_Xaxis() ^ x_2;
        S_alpha_beta_0(1, 1) = T_0_0.Get_A_Yaxis() ^ x_2;
        alpha_0 = S_alpha_beta_0(0, 0) * S_alpha_beta_0(1, 1) - S_alpha_beta_0(0, 1) * S_alpha_beta_0(1, 0);

        M_0(0, 0) = S_alpha_beta_0(0, 0) * S_alpha_beta_0(0, 0);
        M_0(0, 1) = S_alpha_beta_0(0, 1) * S_alpha_beta_0(0, 1);
        M_0(0, 2) = S_alpha_beta_0(0, 1) * S_alpha_beta_0(0, 0);
        M_0(0, 3) = S_alpha_beta_0(0, 0) * S_alpha_beta_0(0, 1);

        M_0(1, 0) = S_alpha_beta_0(1, 0) * S_alpha_beta_0(1, 0);
        M_0(1, 1) = S_alpha_beta_0(1, 1) * S_alpha_beta_0(1, 1);
        M_0(1, 2) = S_alpha_beta_0(1, 1) * S_alpha_beta_0(1, 0);
        M_0(1, 3) = S_alpha_beta_0(1, 0) * S_alpha_beta_0(1, 1);

        M_0(2, 0) = S_alpha_beta_0(0, 0) * S_alpha_beta_0(1, 0);
        M_0(2, 1) = S_alpha_beta_0(0, 1) * S_alpha_beta_0(1, 1);
        M_0(2, 2) = S_alpha_beta_0(0, 0) * S_alpha_beta_0(1, 1);
        M_0(2, 3) = S_alpha_beta_0(0, 1) * S_alpha_beta_0(1, 0);

        M_0(3, 0) = S_alpha_beta_0(0, 0) * S_alpha_beta_0(1, 0);
        M_0(3, 1) = S_alpha_beta_0(0, 1) * S_alpha_beta_0(1, 1);
        M_0(3, 2) = S_alpha_beta_0(0, 1) * S_alpha_beta_0(1, 0);
        M_0(3, 3) = S_alpha_beta_0(0, 0) * S_alpha_beta_0(1, 1);

        M_0_Inv = M_0.inverse();
    }

    for (int i = 0; i < NUMIP; i++) {
        ChMatrixNM<double, 4, 2> L_alpha_B_i;
        ChVector<> x_1 = InterpDeriv_xi1(xa, xi_i[i]);
        ChVector<> x_2 = InterpDeriv_xi2(xa, xi_i[i]);
        S_alpha_beta_i[i](0, 0) = T_0_i[i].Get_A_Xaxis() ^ x_1;
        S_alpha_beta_i[i](1, 0) = T_0_i[i].Get_A_Yaxis() ^ x_1;
        S_alpha_beta_i[i](0, 1) = T_0_i[i].Get_A_Xaxis() ^ x_2;
        S_alpha_beta_i[i](1, 1) = T_0_i[i].Get_A_Yaxis() ^ x_2;
        // alpha_i = det(S_alpha_beta_i)
        alpha_i[i] =
            S_alpha_beta_i[i](0, 0) * S_alpha_beta_i[i](1, 1) - S_alpha_beta_i[i](0, 1) * S_alpha_beta_i[i](1, 0);

        ChMatrixNM<double, 2, 2> xi_i_i;
        xi_i_i = S_alpha_beta_i[i].inverse();

        for (int n = 0; n < NUMNODES; n++) {
            for (int ii = 0; ii < 2; ii++) {
                L_alpha_B_i(n, ii) = LI_J[n][ii](xi_i[i]);
            }
        }

        L_alpha_beta_i[i] = L_alpha_B_i * xi_i_i;

        double t = xi_i[i][0] * xi_i[i][1];
        ChMatrixNM<double, 4, IDOFS> H;
        H.setZero();

        H(0, 0) = xi_i[i][0];
        H(0, 1) = t;

        H(1, 2) = xi_i[i][1];
        H(1, 3) = t;

        H(2, 4) = xi_i[i][0];
        H(2, 5) = t;

        H(3, 6) = xi_i[i][1];
        H(3, 5) = t;

        ChMatrixNM<double, 12, 4> Perm;
        Perm.setZero();

        // 1, 5, 4, 2, 3, 6
        Perm(0, 0) = 1.;
        Perm(1, 2) = 1.;
        Perm(3, 3) = 1.;
        Perm(4, 1) = 1.;

        ChMatrixNM<double, 4, IDOFS> tmpP = M_0_Inv.transpose() * H;

        P_i[i] = (alpha_0 / alpha_i[i]) * Perm * tmpP;
    }
    // save initial axial values
    ComputeIPCurvature();
    for (int i = 0; i < NUMIP; i++) {
        InterpDeriv(xa, L_alpha_beta_i[i], y_i_1[i], y_i_2[i]);
        eps_tilde_1_0_i[i] = T_i[i].transpose() * y_i_1[i];
        eps_tilde_2_0_i[i] = T_i[i].transpose() * y_i_2[i];
        k_tilde_1_0_i[i] = T_i[i].transpose() * k_1_i[i];
        k_tilde_2_0_i[i] = T_i[i].transpose() * k_2_i[i];
    }
    for (int i = 0; i < NUMSSEP; i++) {
        ChMatrixNM<double, 4, 2> L_alpha_B_A;
        ChVector<> x_1 = InterpDeriv_xi1(xa, xi_A[i]);
        ChVector<> x_2 = InterpDeriv_xi2(xa, xi_A[i]);
        S_alpha_beta_A[i](0, 0) = T_0_A[i].Get_A_Xaxis() ^ x_1;
        S_alpha_beta_A[i](1, 0) = T_0_A[i].Get_A_Yaxis() ^ x_1;
        S_alpha_beta_A[i](0, 1) = T_0_A[i].Get_A_Xaxis() ^ x_2;
        S_alpha_beta_A[i](1, 1) = T_0_A[i].Get_A_Yaxis() ^ x_2;

        ChVector<> y_A_1;
        ChVector<> y_A_2;
        InterpDeriv(xa, L_alpha_beta_A[i], y_A_1, y_A_2);
        eps_tilde_1_0_A[i] = T_A[i].transpose() * y_A_1;
        eps_tilde_2_0_A[i] = T_A[i].transpose() * y_A_2;

        // xi_A_i = S_alpha_beta_A^{-1}
        ChMatrixNM<double, 2, 2> xi_A_i;
        xi_A_i = S_alpha_beta_A[i].inverse();

        for (int n = 0; n < NUMNODES; n++) {
            for (int ii = 0; ii < 2; ii++) {
                L_alpha_B_A(n, ii) = LI_J[n][ii](xi_A[i]);
            }
        }

        L_alpha_beta_A[i] = L_alpha_B_A * xi_A_i;
    }
    {
        ChVector<> y_A_1;
        ChVector<> y_A_2;
        for (int i = 0; i < NUMSSEP; i++) {
            InterpDeriv(xa, L_alpha_beta_A[i], y_A_1, y_A_2);
            eps_tilde_1_0_A[i] = T_A[i].transpose() * y_A_1;
            eps_tilde_2_0_A[i] = T_A[i].transpose() * y_A_2;
        }
    }

    // Perform layer initialization
    for (size_t kl = 0; kl < m_layers.size(); kl++) {
        m_layers[kl].SetupInitial();
    }

    // compute initial sizes (just for auxiliary information)
    m_lenX =
        (0.5 * (GetNodeA()->coord.pos + GetNodeD()->coord.pos) - 0.5 * (GetNodeB()->coord.pos + GetNodeC()->coord.pos))
            .Length();
    m_lenY =
        (0.5 * (GetNodeA()->coord.pos + GetNodeB()->coord.pos) - 0.5 * (GetNodeD()->coord.pos + GetNodeC()->coord.pos))
            .Length();

    // Compute mass matrix
    ComputeMassMatrix();
}